

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

dat_t * rdr_readdat(rdr_t *rdr,FILE *file,_Bool lbl)

{
  int iVar1;
  dat_t *__ptr;
  seq_t **ppsVar2;
  seq_t *psVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  
  __ptr = (dat_t *)xmalloc(0x18);
  __ptr->mlen = 0;
  __ptr->nseq = 0;
  __ptr->lbl = lbl;
  ppsVar2 = (seq_t **)xmalloc(8000);
  __ptr->seq = ppsVar2;
  uVar6 = 1000;
  while( true ) {
    iVar1 = feof((FILE *)file);
    if (iVar1 != 0) break;
    psVar3 = rdr_readseq(rdr,file,lbl);
    if (psVar3 == (seq_t *)0x0) break;
    uVar4 = __ptr->nseq;
    ppsVar2 = __ptr->seq;
    if (uVar4 == (uint)uVar6) {
      uVar6 = (ulong)((double)(uVar6 & 0xffffffff) * 1.4);
      ppsVar2 = (seq_t **)xrealloc(ppsVar2,(uVar6 & 0xffffffff) << 3);
      __ptr->seq = ppsVar2;
      uVar4 = __ptr->nseq;
    }
    __ptr->nseq = uVar4 + 1;
    ppsVar2[uVar4] = psVar3;
    uVar5 = psVar3->len;
    if (psVar3->len < __ptr->mlen) {
      uVar5 = __ptr->mlen;
    }
    __ptr->mlen = uVar5;
    if ((uVar4 + 1) % 1000 == 0) {
      info("%7u sequences loaded\n");
    }
  }
  uVar5 = __ptr->nseq;
  if ((ulong)uVar5 == 0) {
    free(__ptr->seq);
    free(__ptr);
    __ptr = (dat_t *)0x0;
  }
  else if (uVar5 < (uint)uVar6) {
    ppsVar2 = (seq_t **)xrealloc(__ptr->seq,(ulong)uVar5 << 3);
    __ptr->seq = ppsVar2;
  }
  return __ptr;
}

Assistant:

dat_t *rdr_readdat(rdr_t *rdr, FILE *file, bool lbl) {
	// Prepare dataset
	uint32_t size = 1000;
	dat_t *dat = xmalloc(sizeof(dat_t));
	dat->nseq = 0;
	dat->mlen = 0;
	dat->lbl = lbl;
	dat->seq = xmalloc(sizeof(seq_t *) * size);
	// Load sequences
	while (!feof(file)) {
		// Read the next sequence
		seq_t *seq = rdr_readseq(rdr, file, lbl);
		if (seq == NULL)
			break;
		// Grow the buffer if needed
		if (dat->nseq == size) {
			size *= 1.4;
			dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * size);
		}
		// And store the sequence
		dat->seq[dat->nseq++] = seq;
		dat->mlen = max(dat->mlen, seq->len);
		if (dat->nseq % 1000 == 0)
			info("%7"PRIu32" sequences loaded\n", dat->nseq);
	}
	// If no sequence readed, cleanup and repport
	if (dat->nseq == 0) {
		free(dat->seq);
		free(dat);
		return NULL;
	}
	// Adjust the dataset size and return
	if (size > dat->nseq)
		dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * dat->nseq);
	return dat;
}